

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

char * duckdb_brotli::BrotliDecoderErrorString(BrotliDecoderErrorCode c)

{
  if ((uint)(c + 0x1f) < 0x23) {
    return &DAT_013ff930 + *(int *)(&DAT_013ff930 + (ulong)(uint)(c + 0x1f) * 4);
  }
  return "INVALID";
}

Assistant:

const char *BrotliDecoderErrorString(BrotliDecoderErrorCode c) {
	switch (c) {
#define BROTLI_ERROR_CODE_CASE_(PREFIX, NAME, CODE) \
    case BROTLI_DECODER##PREFIX##NAME: return #PREFIX #NAME;
#define BROTLI_NOTHING_
		BROTLI_DECODER_ERROR_CODES_LIST(BROTLI_ERROR_CODE_CASE_, BROTLI_NOTHING_)
#undef BROTLI_ERROR_CODE_CASE_
#undef BROTLI_NOTHING_
	default:
		return "INVALID";
	}
}